

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *this_00;
  GLuint program;
  RenderContext *context;
  ulong uVar1;
  string *a;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int x;
  int iVar11;
  deUint8 *ptr;
  uint uVar12;
  string *a_00;
  unsigned_short uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  Vec4 *b;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_268;
  RGBA threshold;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  int local_1f8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface reference;
  Surface rendered;
  Vector<float,_4> local_188;
  Vec4 color;
  Vec4 v00;
  PixelBufferAccess dstAccess;
  Vec4 v10;
  Vector<float,_4> local_f8;
  string imageSetDesc;
  Vec4 v11;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vec4 v01;
  int *piVar5;
  
  iVar3 = (*((this->super_BufferVerifierBase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar5 = (int *)CONCAT44(extraout_var,iVar3);
  uVar6 = (long)*piVar5 / 8 & 0xffffffff;
  if (0x7f < (int)((long)*piVar5 / 8)) {
    uVar6 = 0x80;
  }
  iVar3 = 0x80;
  if (piVar5[1] / 8 < 0x80) {
    iVar3 = piVar5[1] / 8;
  }
  program = (this->m_program->m_program).m_program;
  dstAccess.super_ConstPixelBufferAccess.m_format.order =
       (ChannelOrder)tcu::PixelFormat::getColorThreshold((PixelFormat *)(piVar5 + 2));
  imageSetDesc._M_dataplus._M_p._0_4_ = 0x4040404;
  threshold = tcu::operator+((RGBA *)&dstAccess,(RGBA *)&imageSetDesc);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&rendered);
  tcu::Surface::Surface(&reference);
  local_268 = (int)uVar6;
  uVar18 = iVar3 * local_268;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&positions,(long)(int)(uVar18 * 4));
  iVar4 = 0;
  uVar10 = 0;
  if (0 < local_268) {
    uVar10 = uVar6;
  }
  iVar9 = 0;
  if (0 < iVar3) {
    iVar9 = iVar3;
  }
  iVar15 = 3;
  while (iVar4 != iVar9) {
    fVar19 = (float)iVar4;
    iVar4 = iVar4 + 1;
    fVar19 = fVar19 / (float)iVar3;
    fVar20 = (float)iVar4 / (float)iVar3;
    fVar19 = fVar19 + fVar19 + -1.0;
    fVar20 = fVar20 + fVar20 + -1.0;
    uVar17 = 0;
    iVar16 = iVar15;
    while (uVar10 != uVar17) {
      fVar21 = (float)(int)uVar17 / (float)local_268;
      uVar17 = uVar17 + 1;
      fVar22 = (float)(int)uVar17 / (float)local_268;
      fVar21 = fVar21 + fVar21 + -1.0;
      fVar22 = fVar22 + fVar22 + -1.0;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -3].m_data[0] = fVar21;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -3].m_data[1] = fVar19;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -2].m_data[0] = fVar21;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -2].m_data[1] = fVar20;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -1].m_data[0] = fVar22;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16 + -1].m_data[1] = fVar19;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16].m_data[0] = fVar22;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar16].m_data[1] = fVar20;
      iVar16 = iVar16 + 4;
    }
    iVar15 = iVar15 + local_268 * 4;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&indices,(long)(int)(uVar18 * 6));
  lVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar18) {
    uVar10 = (ulong)uVar18;
  }
  uVar13 = 3;
  for (; uVar10 * 6 - lVar8 != 0; lVar8 = lVar8 + 6) {
    iVar4 = (int)lVar8;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4] = uVar13 - 1;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4 + 1] = uVar13 - 3;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4 + 2] = uVar13 - 2;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4 + 3] = uVar13 - 1;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4 + 4] = uVar13 - 2;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4 + 5] = uVar13;
    uVar13 = uVar13 + 4;
  }
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,local_268 * 8,iVar3 << 3);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,this->m_posLoc,2,0x1406,'\0',0,
             positions.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)ctx);
  uVar18 = uVar18 * 0xc;
  iVar4 = (int)tbs;
  local_1f8 = (int)siglen;
  iVar3 = 0;
  do {
    iVar9 = iVar3;
    uVar12 = 0xc;
    uVar14 = iVar4 - iVar9;
    if (uVar14 == 0 || iVar4 < iVar9) break;
    iVar3 = iVar4 + -0xc;
    if ((0xb < (int)uVar14) &&
       (uVar14 = uVar14 - uVar14 % 0xc, iVar3 = iVar9, uVar12 = uVar14, (int)uVar18 < (int)uVar14))
    {
      uVar14 = uVar18;
      uVar12 = uVar18;
    }
    uVar10 = (long)(int)uVar12 / 0xc;
    iVar15 = (int)uVar10;
    uVar17 = uVar10;
    if (local_268 < iVar15) {
      uVar17 = uVar6;
    }
    uVar1 = (ulong)(uint)(iVar15 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v10,"Bytes ",(allocator<char> *)&local_f8);
    fVar19 = (float)(local_1f8 + iVar3);
    color.m_data[0] = fVar19;
    de::toString<int>((string *)&v01,(int *)&color);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v10,
                   (string *)&v01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstAccess,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v00," to ")
    ;
    local_188.m_data[0] = (float)((int)fVar19 + uVar12 + -1);
    de::toString<int>((string *)&v11,(int *)&local_188);
    std::operator+(&imageSetDesc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstAccess,
                   (string *)&v11);
    std::__cxx11::string::~string((string *)&v11);
    std::__cxx11::string::~string((string *)&dstAccess);
    std::__cxx11::string::~string((string *)&v00);
    std::__cxx11::string::~string((string *)&v01);
    std::__cxx11::string::~string((string *)&v10);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)(int)fVar19);
    glu::CallLogWrapper::glDrawElements
              (this_00,4,iVar15 * 6,0x1403,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start);
    iVar16 = (int)uVar17;
    uVar10 = (ulong)(uint)(iVar15 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
    tcu::Surface::setSize
              (&reference,iVar16 * 8,
               (((int)((long)uVar10 / (long)iVar16) + 1) -
               (uint)((int)((long)uVar10 % (long)iVar16) == 0)) * 8);
    tcu::Surface::getAccess(&dstAccess,&reference);
    v00.m_data[0] = 0.0;
    v00.m_data[1] = 0.0;
    v00.m_data[2] = 0.0;
    v00.m_data[3] = 3.57331e-43;
    tcu::clear(&dstAccess,(IVec4 *)&v00);
    ptr = sig + (long)iVar3 + (long)local_1f8;
    iVar3 = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    for (; iVar3 != iVar15; iVar3 = iVar3 + 1) {
      uVar12 = iVar3 * 4;
      fetchVtxColor((BufferTestUtil *)&v00,ptr,uVar12);
      fetchVtxColor((BufferTestUtil *)&v10,ptr,uVar12 | 1);
      fetchVtxColor((BufferTestUtil *)&v01,ptr,uVar12 | 2);
      fetchVtxColor((BufferTestUtil *)&v11,ptr,uVar12 | 3);
      for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
        fVar19 = ((float)iVar7 + 0.5) * 0.125;
        for (iVar11 = 0; iVar11 != 8; iVar11 = iVar11 + 1) {
          fVar21 = ((float)iVar11 + 0.5) * 0.125;
          bVar2 = 1.0 < fVar19 + fVar21;
          fVar20 = fVar19;
          if (bVar2) {
            fVar20 = 1.0 - fVar19;
          }
          b = &v11;
          if (!bVar2) {
            b = &v00;
          }
          a_00 = (string *)&v01;
          a = (string *)&v10;
          if (!bVar2) {
            a_00 = (string *)&v10;
            a = (string *)&v01;
          }
          tcu::operator-((tcu *)&local_60,(Vector<float,_4> *)a,b);
          uVar12 = -(uint)(fVar19 + fVar21 <= 1.0);
          tcu::operator*((tcu *)&local_f8,
                         (float)(uVar12 & (uint)fVar21 | ~uVar12 & (uint)(1.0 - fVar21)),&local_60);
          tcu::operator+((tcu *)&local_188,b,&local_f8);
          tcu::operator-((tcu *)&local_80,(Vector<float,_4> *)a_00,b);
          tcu::operator*((tcu *)&local_70,fVar20,&local_80);
          tcu::operator+((tcu *)&color,&local_188,&local_70);
          tcu::PixelBufferAccess::setPixel
                    (&dstAccess,&color,(iVar3 % iVar16) * 8 + iVar11,iVar7 + (iVar3 / iVar16) * 8,0)
          ;
        }
      }
    }
    tcu::Surface::setSize
              (&rendered,iVar16 * 8,
               (((int)((long)uVar1 / (long)local_268) + 1) -
               (uint)((int)((long)uVar1 % (long)local_268) == 0)) * 8);
    context = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    tcu::Surface::getAccess(&dstAccess,&rendered);
    glu::readPixels(context,0,0,&dstAccess);
    bVar2 = tcu::pixelThresholdCompare
                      (((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,"RenderResult"
                       ,(char *)CONCAT44(imageSetDesc._M_dataplus._M_p._4_4_,
                                         imageSetDesc._M_dataplus._M_p._0_4_),&reference,&rendered,
                       &threshold,COMPARE_LOG_RESULT);
    std::__cxx11::string::~string((string *)&imageSetDesc);
    iVar3 = uVar14 + iVar9;
  } while (bVar2);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,this->m_byteVecLoc);
  tcu::Surface::~Surface(&reference);
  tcu::Surface::~Surface(&rendered);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return (int)CONCAT71((int7)((ulong)this_00 >> 8),iVar4 <= iVar9);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(4,4,4,4);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	0);
	glBindBuffer				(GL_ARRAY_BUFFER,			0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, &indices[0]);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_context.getRenderContext(), 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glDisableVertexAttribArray	(m_posLoc);
	glDisableVertexAttribArray	(m_byteVecLoc);

	return isOk;
}